

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O0

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>
          (NLW2_NLFeeder_C_Impl *this,int i,SingleSparseVecWrtFactory<int,_double> *clewf)

{
  _func_int_void_ptr_int *p_Var1;
  NLW2_NLFeeder_C *pNVar2;
  int in_ESI;
  SingleSparseVecWrtFactory<int,_double> *in_RDI;
  function<void_(int,_double)> svw;
  SparseVectorWriter<int,_double> sv;
  int nnz;
  anon_class_8_1_3fcf6721 *__f;
  function<void_(int,_double)> *in_stack_ffffffffffffff80;
  _func_void_void_ptr_int_void_ptr *p_Var3;
  anon_class_8_1_3fcf6721 local_50 [4];
  SparseVectorWriter<int,_double> local_30;
  int local_1c;
  int local_c;
  
  local_c = in_ESI;
  pNVar2 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
  p_Var1 = pNVar2->LinearConExprNNZ;
  pNVar2 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
  local_1c = (*p_Var1)(pNVar2->p_user_data_,local_c);
  if (local_1c != 0) {
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              (in_RDI,(size_t)in_stack_ffffffffffffff80);
    __f = local_50;
    std::function<void(int,double)>::
    function<mp::NLW2_NLFeeder_C_Impl::FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>(int,mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>&)::_lambda(int,double)_1_,void>
              (in_stack_ffffffffffffff80,__f);
    pNVar2 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
    p_Var3 = pNVar2->FeedLinearConExpr;
    pNVar2 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
    (*p_Var3)(pNVar2->p_user_data_,local_c,__f);
    std::function<void_(int,_double)>::~function((function<void_(int,_double)> *)0x116732);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SparseVectorWriter<int,_double>::~SparseVectorWriter(&local_30);
  }
  return;
}

Assistant:

void FeedLinearConExpr(int i, ConLinearExprWriterFactory& clewf) {
    assert(NLF().LinearConExprNNZ);
    int nnz = NLF().LinearConExprNNZ(NLF().p_user_data_, i);
    if (nnz) {
      auto sv = clewf.MakeVectorWriter(nnz);
      assert(NLF().FeedLinearConExpr);
      std::function<void(int, double)> svw
          = [&sv](int i, double v){
        sv.Write(i, v);
      };
      NLF().FeedLinearConExpr(NLF().p_user_data_, i, &svw);
    }
  }